

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_match_size_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_detection_rule_entry *pcVar3;
  char *__s;
  char *string_value;
  coda_expression *op2;
  coda_expression *op1;
  
  info->node->free_data = coda_detection_rule_entry_delete;
  pcVar3 = coda_detection_rule_entry_new((char *)0x0);
  pnVar1 = info->node;
  pnVar1->data = pcVar3;
  if ((pcVar3 != (coda_detection_rule_entry *)0x0) &&
     (__s = get_mandatory_attribute_value(attr,"size",pnVar1->tag), __s != (char *)0x0)) {
    string_value = strdup(__s);
    if (string_value == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0xa8b);
      return -1;
    }
    op2 = coda_expression_new(expr_constant_integer,string_value,(coda_expression *)0x0,
                              (coda_expression *)0x0,(coda_expression *)0x0,(coda_expression *)0x0);
    if (op2 == (coda_expression *)0x0) {
      coda_set_error(-400,"invalid \'size\' attribute value \'%s\'",__s);
    }
    else {
      op1 = coda_expression_new(expr_file_size,(char *)0x0,(coda_expression *)0x0,
                                (coda_expression *)0x0,(coda_expression *)0x0,(coda_expression *)0x0
                               );
      if (op1 != (coda_expression *)0x0) {
        op2 = coda_expression_new(expr_equal,(char *)0x0,op1,op2,(coda_expression *)0x0,
                                  (coda_expression *)0x0);
        if (op2 == (coda_expression *)0x0) {
          return -1;
        }
        iVar2 = coda_detection_rule_entry_set_expression
                          ((coda_detection_rule_entry *)info->node->data,op2);
        if (iVar2 == 0) {
          return 0;
        }
      }
      coda_expression_delete(op2);
    }
  }
  return -1;
}

Assistant:

static int cd_match_size_init(parser_info *info, const char **attr)
{
    const char *size_string;
    coda_expression *lh_expr;
    coda_expression *rh_expr;
    coda_expression *expr;
    char *string_value;

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;
    info->node->data = coda_detection_rule_entry_new(NULL);
    if (info->node->data == NULL)
    {
        return -1;
    }

    size_string = get_mandatory_attribute_value(attr, "size", info->node->tag);
    if (size_string == NULL)
    {
        return -1;
    }
    string_value = strdup(size_string);
    if (string_value == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    rh_expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
    if (rh_expr == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'size' attribute value '%s'", size_string);
        return -1;
    }
    lh_expr = coda_expression_new(expr_file_size, NULL, NULL, NULL, NULL, NULL);
    if (lh_expr == NULL)
    {
        coda_expression_delete(rh_expr);
        return -1;
    }
    expr = coda_expression_new(expr_equal, NULL, lh_expr, rh_expr, NULL, NULL);
    if (expr == NULL)
    {
        return -1;
    }
    if (coda_detection_rule_entry_set_expression((coda_detection_rule_entry *)info->node->data, expr) != 0)
    {
        coda_expression_delete(expr);
        return -1;
    }

    return 0;
}